

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O3

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::elementBegin(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
               *this,ParserChar *elementName,ParserAttributes *attributes)

{
  iterator *piVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  _Elt_pointer pNVar6;
  NamespaceStackFrame *pNVar7;
  IUnknownElementHandler *pIVar8;
  _Elt_pointer pEVar9;
  bool bVar10;
  char cVar11;
  byte bVar12;
  byte bVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  _Base_ptr p_Var17;
  mapped_type *ppIVar19;
  long lVar20;
  _Elt_pointer pNVar21;
  xmlChar **ppxVar22;
  ElementFunctionMap *pEVar23;
  _Elt_pointer pNVar24;
  ElementData *pEVar25;
  long *plVar26;
  mapped_type pIVar27;
  _Base_ptr p_Var28;
  _Rb_tree_header *p_Var29;
  StringHashPair SVar30;
  void *attributeData;
  StringHash namespaceHash;
  StringHashPair hashPair;
  void *validationData;
  long local_68;
  _Base_ptr local_60;
  StringHashPair local_58;
  size_t sStack_48;
  void *pvStack_40;
  undefined8 local_38;
  _Base_ptr p_Var18;
  
  sVar3 = this->mIgnoreElements;
  sVar4 = this->mUnknownElements;
  sVar5 = this->mNamespaceElements;
  if ((sVar3 != 0 || sVar4 != 0) || sVar5 != 0) {
    pNVar21 = (this->mNamespacesStack).c.
              super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pNVar21 !=
        (this->mNamespacesStack).c.
        super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      if (pNVar21 ==
          (this->mNamespacesStack).c.
          super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pNVar21 = (this->mNamespacesStack).c.
                  super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
      }
      pNVar21[-1].counter = pNVar21[-1].counter + 1;
    }
    if (sVar3 != 0) {
      this->mIgnoreElements = sVar3 + 1;
      return (bool)1;
    }
    if (sVar4 != 0) {
      this->mUnknownElements = sVar4 + 1;
      pIVar8 = this->mUnknownHandler;
      if (pIVar8 == (IUnknownElementHandler *)0x0) {
        return (bool)1;
      }
      iVar15 = (*pIVar8->_vptr_IUnknownElementHandler[2])(pIVar8,elementName,attributes->attributes)
      ;
      return SUB41(iVar15,0);
    }
    if (sVar5 != 0) {
      this->mNamespaceElements = sVar5 + 1;
      local_58 = Utils::calculateStringHashWithNamespace(elementName);
      pEVar25 = (ElementData *)&((ElementData *)&local_58)->generatedElementHash;
      pIVar27 = this->mActiveNamespaceHandler;
      ppxVar22 = attributes->attributes;
      lVar20 = *(long *)pIVar27;
      goto LAB_006bfd26;
    }
  }
  iVar15 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[7])(this);
  if ((char)iVar15 != '\0') {
    parseNamespaceDeclarations(this,attributes);
  }
  SVar30 = Utils::calculateStringHashWithNamespace(elementName);
  uVar16 = SVar30.first;
  local_60 = (_Base_ptr)0x0;
  pNVar21 = (this->mNamespacesStack).c.
            super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pNVar21 !=
      (this->mNamespacesStack).c.
      super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pNVar6 = (this->mNamespacesStack).c.
             super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    if (pNVar21 == pNVar6) {
      pNVar7 = (this->mNamespacesStack).c.
               super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
      psVar2 = &pNVar7[8].counter;
      *psVar2 = *psVar2 + 1;
      pNVar24 = pNVar7 + 9;
    }
    else {
      pNVar21[-1].counter = pNVar21[-1].counter + 1;
      pNVar24 = pNVar21;
    }
    p_Var18 = pNVar24[-1].namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var17 = &pNVar24[-1].namespaces._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var28 = p_Var17;
    if (p_Var18 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var18 + 1) >= uVar16) {
          p_Var28 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[*(ulong *)(p_Var18 + 1) < uVar16];
      } while (p_Var18 != (_Base_ptr)0x0);
      if ((p_Var28 != p_Var17) && (*(ulong *)(p_Var28 + 1) <= uVar16)) {
        p_Var17 = p_Var28;
      }
    }
    if (pNVar21 == pNVar6) {
      pNVar21 = (this->mNamespacesStack).c.
                super__Deque_base<GeneratedSaxParser::NamespaceStackFrame,_std::allocator<GeneratedSaxParser::NamespaceStackFrame>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    if ((_Rb_tree_header *)p_Var17 != &pNVar21[-1].namespaces._M_t._M_impl.super__Rb_tree_header) {
      local_60 = p_Var17[1]._M_parent;
    }
  }
  local_58.second = 0;
  local_58.first = SVar30.second;
  sStack_48 = 0;
  pvStack_40 = (void *)0x0;
  iVar15 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[5])(this);
  if ((char)iVar15 == '\0') {
    bVar14 = false;
  }
  else {
    p_Var18 = (this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var18 == (_Base_ptr)0x0) {
LAB_006bfbdc:
      pEVar23 = this->mCurrentElementFunctionMap;
      if (this->mCurrentElementFunctionMap == (ElementFunctionMap *)0x0) {
        pEVar23 = &this->mElementFunctionMap;
      }
      p_Var18 = &(pEVar23->_M_t)._M_impl.super__Rb_tree_header._M_header;
LAB_006bfbf5:
      bVar14 = false;
      bVar10 = false;
      if (this->mLaxNamespaceHandling != true) goto LAB_006bfcf0;
    }
    else {
      p_Var29 = &(this->mElementToNamespaceMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = &p_Var29->_M_header;
      do {
        if (*(ulong *)(p_Var18 + 1) >= local_58.second) {
          p_Var17 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[*(ulong *)(p_Var18 + 1) < local_58.second];
      } while (p_Var18 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var17 == p_Var29) || (local_58.second < *(ulong *)(p_Var17 + 1)))
      goto LAB_006bfbdc;
      pEVar23 = this->mCurrentElementFunctionMap;
      if (this->mCurrentElementFunctionMap == (ElementFunctionMap *)0x0) {
        pEVar23 = &this->mElementFunctionMap;
      }
      p_Var18 = &(pEVar23->_M_t)._M_impl.super__Rb_tree_header._M_header;
      bVar10 = true;
      if (p_Var17[1]._M_parent != local_60) goto LAB_006bfbf5;
    }
    bVar14 = bVar10;
    p_Var17 = (pEVar23->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var28 = p_Var18;
    if (p_Var17 != (_Base_ptr)0x0) {
      do {
        if (*(ulong *)(p_Var17 + 1) >= local_58.second) {
          p_Var28 = p_Var17;
        }
        p_Var17 = (&p_Var17->_M_left)[*(ulong *)(p_Var17 + 1) < local_58.second];
      } while (p_Var17 != (_Base_ptr)0x0);
      if ((p_Var28 != p_Var18) && (*(ulong *)(p_Var28 + 1) <= local_58.second)) {
        local_68 = 0;
        local_38 = 0;
        p_Var18 = p_Var28[2]._M_right;
        if (p_Var18 == (_Base_ptr)0x0) {
          return (bool)0;
        }
        plVar26 = (long *)((long)&(this->super_ParserTemplateBase).super_Parser._vptr_Parser +
                          *(long *)(p_Var28 + 3));
        if (((ulong)p_Var18 & 1) != 0) {
          p_Var18 = *(_Base_ptr *)(*plVar26 + -1 + (long)p_Var18);
        }
        cVar11 = (*(code *)p_Var18)(plVar26,attributes,&local_68,&local_38);
        if (cVar11 == '\0') {
          if (local_68 != 0) {
            p_Var18 = p_Var28[3]._M_right;
            if (((ulong)p_Var18 & 1) != 0) {
              p_Var18 = *(_Base_ptr *)
                         (*(long *)((long)&(this->super_ParserTemplateBase).super_Parser.
                                           _vptr_Parser + *(long *)(p_Var28 + 4)) + -1 +
                         (long)p_Var18);
            }
            (*(code *)p_Var18)();
            StackMemoryManager::deleteObject(&(this->super_ParserTemplateBase).mStackMemoryManager);
          }
        }
        else {
          p_Var18 = p_Var28[1]._M_parent;
          plVar26 = (long *)((long)&(p_Var28[1]._M_left)->_M_color + (long)this);
          if (((ulong)p_Var18 & 1) != 0) {
            p_Var18 = *(_Base_ptr *)(*plVar26 + -1 + (long)p_Var18);
          }
          bVar12 = (*(code *)p_Var18)(plVar26,local_68);
          bVar13 = bVar12;
          if (local_68 != 0) {
            p_Var18 = p_Var28[3]._M_right;
            if (((ulong)p_Var18 & 1) != 0) {
              p_Var18 = *(_Base_ptr *)
                         (*(long *)((long)&(this->super_ParserTemplateBase).super_Parser.
                                           _vptr_Parser + *(long *)(p_Var28 + 4)) + -1 +
                         (long)p_Var18);
            }
            bVar13 = (*(code *)p_Var18)();
            StackMemoryManager::deleteObject(&(this->super_ParserTemplateBase).mStackMemoryManager);
            bVar13 = bVar12 & bVar13;
          }
          if (bVar13 != 0) {
            pEVar9 = (this->super_ParserTemplateBase).mElementDataStack.
                     super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pEVar9 != (this->super_ParserTemplateBase).mElementDataStack.
                          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              pEVar9->typeID = sStack_48;
              pEVar9->validationData = pvStack_40;
              pEVar9->elementHash = local_58.first;
              pEVar9->generatedElementHash = local_58.second;
              piVar1 = &(this->super_ParserTemplateBase).mElementDataStack.
                        super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
              return (bool)bVar12;
            }
            std::
            deque<GeneratedSaxParser::ParserTemplateBase::ElementData,std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>>
            ::_M_push_back_aux<GeneratedSaxParser::ParserTemplateBase::ElementData_const&>
                      ((deque<GeneratedSaxParser::ParserTemplateBase::ElementData,std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>>
                        *)&(this->super_ParserTemplateBase).mElementDataStack,
                       (ElementData *)&local_58);
            return (bool)bVar12;
          }
        }
        return (bool)0;
      }
    }
  }
LAB_006bfcf0:
  ppIVar19 = std::
             map<unsigned_long,_GeneratedSaxParser::INamespaceHandler_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::INamespaceHandler_*>_>_>
             ::operator[](&this->mNamespaceHandlers,(key_type *)&local_60);
  pIVar27 = *ppIVar19;
  if (pIVar27 == (mapped_type)0x0) {
    iVar15 = (*(this->super_ParserTemplateBase).super_Parser._vptr_Parser[6])(this);
    if (((char)iVar15 == '\0') &&
       (p_Var18 = (this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       , p_Var18 != (_Base_ptr)0x0)) {
      p_Var29 = &(this->mElementFunctionMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = &p_Var29->_M_header;
      do {
        if (*(ulong *)(p_Var18 + 1) >= local_58.first) {
          p_Var17 = p_Var18;
        }
        p_Var18 = (&p_Var18->_M_left)[*(ulong *)(p_Var18 + 1) < local_58.first];
      } while (p_Var18 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var17 != p_Var29) &&
         (bVar14 && *(ulong *)(p_Var17 + 1) <= local_58.first)) {
        this->mIgnoreElements = 1;
        return true;
      }
    }
    this->mUnknownElements = 1;
    if (this->mIgnoreElements != 0) {
      return (bool)1;
    }
    pIVar8 = this->mUnknownHandler;
    if (pIVar8 != (IUnknownElementHandler *)0x0) {
      iVar15 = (*pIVar8->_vptr_IUnknownElementHandler[2])(pIVar8,elementName,attributes->attributes)
      ;
      return (bool)(byte)iVar15;
    }
    bVar14 = ParserTemplateBase::handleError
                       (&this->super_ParserTemplateBase,SEVERITY_ERROR_NONCRITICAL,
                        ERROR_UNKNOWN_ELEMENT,0,elementName);
    return !bVar14;
  }
  this->mActiveNamespaceHandler = pIVar27;
  this->mNamespaceElements = 1;
  ppxVar22 = attributes->attributes;
  lVar20 = *(long *)pIVar27;
  pEVar25 = (ElementData *)&local_58;
LAB_006bfd26:
  bVar13 = (**(code **)(lVar20 + 0x10))(pIVar27,pEVar25,elementName,ppxVar22);
  return (bool)bVar13;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::elementBegin( const ParserChar* elementName,
																   const ParserAttributes& attributes)
	{
        if ( (mIgnoreElements > 0 || mUnknownElements > 0 || mNamespaceElements > 0) 
            && !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
        }
        if ( mIgnoreElements > 0 )
        {
            mIgnoreElements++;
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            mUnknownElements++;
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->elementBegin( elementName, attributes.attributes );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            mNamespaceElements++;
            StringHashPair hashPair = Utils::calculateStringHashWithNamespace( elementName );
            return mActiveNamespaceHandler->elementBegin( hashPair.second, elementName, attributes.attributes );
        }

        if ( isDifferentNamespaceAllowed() )
        {
            parseNamespaceDeclarations( attributes );
        }
        ElementData newElementData;
        StringHashPair elementNsPair = Utils::calculateStringHashWithNamespace(elementName);
        newElementData.elementHash = elementNsPair.second;
        StringHash currentNsPrefix = elementNsPair.first;
        StringHash namespaceHash = 0;
        if ( !mNamespacesStack.empty() )
        {
            mNamespacesStack.top().counter++;
            typename NamespacePrefixesMap::iterator nsIter = mNamespacesStack.top().namespaces.find( currentNsPrefix );
            if ( nsIter != mNamespacesStack.top().namespaces.end() )
            {
                namespaceHash = nsIter->second;
            }
        }
        newElementData.generatedElementHash = 0;
        newElementData.typeID = 0;
        newElementData.validationData = 0;
        bool foundElementHash = findElementHash( newElementData );

        bool correctNamespace = false;
        if ( foundElementHash )
        {
            typename NamespacePrefixesMap::const_iterator nsFromMap = mElementToNamespaceMap.find( newElementData.generatedElementHash );
            if ( nsFromMap != mElementToNamespaceMap.end() && nsFromMap->second == namespaceHash )
            {
                correctNamespace = true;
            }
        }

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
        typename ElementFunctionMap::const_iterator it = functionMapToUse->end();
        if ( foundElementHash && (correctNamespace || mLaxNamespaceHandling) )
            it = functionMapToUse->find(newElementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
		{
            INamespaceHandler* nsHandler = mNamespaceHandlers[ namespaceHash ];
            if ( nsHandler != 0 )
            {
                mActiveNamespaceHandler = nsHandler;
                mNamespaceElements = 1;
                return nsHandler->elementBegin( newElementData.elementHash, elementName, attributes.attributes );
            }
            if ( isXsAnyAllowed( newElementData.elementHash ) )
            {
                mUnknownElements = 1;
            }
            else
            {
                it = mElementFunctionMap.find(newElementData.elementHash);
                if ( it != mElementFunctionMap.end() && correctNamespace )
                {
                    mIgnoreElements = 1;
                }
                else
                {
                    mUnknownElements = 1;
                }
            }
            if ( mIgnoreElements )
            {
                return true;
            }
            if ( mUnknownElements )
            {
                if ( mUnknownHandler != 0 )
                {
                    return mUnknownHandler->elementBegin( elementName, attributes.attributes );
                }
                else
                {
			        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
							         ParserError::ERROR_UNKNOWN_ELEMENT,
				                     0,
				                     elementName))
			        {
				        return false;
			        }
			        else
			        {
				        return true;
			        }
                }
            }
		}
		const FunctionStruct& functions = it->second;

		void* attributeData = 0;
		void* validationData = 0;
		if ( !functions.validateBeginFunction || !(static_cast<DerivedClass*>(this)->*functions.validateBeginFunction)(attributes, &attributeData, &validationData) )
        {
            // avoid leak
            if ( attributeData )
            {
                (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
                mStackMemoryManager.deleteObject(); // attribute data
            }
			return false;
        }

		bool success = (static_cast<DerivedClass*>(this)->*functions.beginFunction)(attributeData);
		if ( attributeData )
        {
            bool attrFreeSuccess = (static_cast<DerivedClass*>(this)->*functions.freeAttributesFunction)(attributeData);
			mStackMemoryManager.deleteObject(); // attribute data
            if ( !attrFreeSuccess )
            {
                return false;
            }
        }

		if ( success )
		{
            mElementDataStack.push_back(newElementData);
			newElementData.validationData = validationData;
		}
		return success;
	}